

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_concat(lua_State *L,int total)

{
  char cVar1;
  StkId pSVar2;
  long lVar3;
  char *pcVar4;
  byte bVar5;
  ulong uVar6;
  TString *pTVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  ulong l;
  StkId obj;
  size_t sVar11;
  int iVar12;
  ulong uVar13;
  StkId pSVar14;
  char buff [40];
  char local_58 [40];
  
  if (total != 1) {
    do {
      pSVar2 = (L->top).p;
      if ((byte)((*(byte *)((long)pSVar2 + -0x18) & 0xf) - 3) < 2) {
        pSVar14 = pSVar2 + -1;
        bVar5 = *(byte *)((long)pSVar2 + -8) & 0xf;
        if (bVar5 != 4) {
          if (bVar5 != 3) goto LAB_0011e759;
          luaO_tostring(L,&pSVar14->val);
        }
        obj = pSVar2 + -2;
        cVar1 = *(char *)((long)pSVar2 + -8);
        if ((cVar1 == 'D') && ((pSVar14->val).value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
          iVar12 = 1;
          if ((undefined1  [16])((undefined1  [16])*pSVar2 & (undefined1  [16])0xf) ==
              (undefined1  [16])0x3) {
            luaO_tostring(L,&obj->val);
          }
        }
        else {
          if ((*(char *)((long)pSVar2 + -0x18) == 'D') &&
             ((obj->val).value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
            pSVar2[-2].val.value_ = pSVar2[-1].val.value_;
            *(char *)((long)pSVar2 + -0x18) = cVar1;
            goto LAB_0011e761;
          }
          l = (ulong)*(char *)(*(long *)pSVar14 + 0xb);
          if ((long)l < 0) {
            l = *(ulong *)(*(long *)pSVar14 + 0x10);
          }
          uVar13 = 1;
          if (1 < total) {
            uVar13 = 1;
            do {
              bVar5 = (obj->val).tt_ & 0xf;
              if (bVar5 != 4) {
                if (bVar5 != 3) goto LAB_0011e6d3;
                luaO_tostring(L,&obj->val);
              }
              uVar6 = (ulong)*(char *)(*(long *)obj + 0xb);
              if ((long)uVar6 < 0) {
                uVar6 = *(ulong *)(*(long *)obj + 0x10);
              }
              if (0x7fffffffffffffcf - l <= uVar6) {
                (L->top).p = pSVar2 + -(ulong)(uint)total;
                luaG_runerror(L,"string length overflow");
              }
              l = l + uVar6;
              uVar13 = uVar13 + 1;
              obj = obj + -1;
            } while ((uint)total != uVar13);
            uVar13 = (ulong)(uint)total;
          }
LAB_0011e6d3:
          uVar6 = uVar13 & 0xffffffff;
          if (l < 0x29) {
            lVar8 = uVar6 + 1;
            pSVar14 = pSVar2 + -uVar6;
            lVar9 = 0;
            do {
              lVar3 = *(long *)pSVar14;
              sVar11 = (size_t)*(char *)(lVar3 + 0xb);
              if ((long)sVar11 < 0) {
                sVar11 = *(size_t *)(lVar3 + 0x10);
                pvVar10 = *(void **)(lVar3 + 0x18);
              }
              else {
                pvVar10 = (void *)(lVar3 + 0x18);
              }
              memcpy(local_58 + lVar9,pvVar10,sVar11);
              lVar9 = lVar9 + sVar11;
              lVar8 = lVar8 + -1;
              pSVar14 = pSVar14 + 1;
            } while (1 < lVar8);
            pTVar7 = luaS_newlstr(L,local_58,l);
          }
          else {
            pTVar7 = luaS_createlngstrobj(L,l);
            pcVar4 = pTVar7->contents;
            lVar8 = uVar6 + 1;
            pSVar14 = pSVar2 + -uVar6;
            lVar9 = 0;
            do {
              lVar3 = *(long *)pSVar14;
              sVar11 = (size_t)*(char *)(lVar3 + 0xb);
              if ((long)sVar11 < 0) {
                sVar11 = *(size_t *)(lVar3 + 0x10);
                pvVar10 = *(void **)(lVar3 + 0x18);
              }
              else {
                pvVar10 = (void *)(lVar3 + 0x18);
              }
              memcpy(pcVar4 + lVar9,pvVar10,sVar11);
              lVar9 = lVar9 + sVar11;
              lVar8 = lVar8 + -1;
              pSVar14 = pSVar14 + 1;
            } while (1 < lVar8);
          }
          *(TString **)(pSVar2 + -uVar6) = pTVar7;
          pSVar2[-uVar6].val.tt_ = pTVar7->tt | 0x40;
          iVar12 = (int)uVar13 + -1;
        }
      }
      else {
LAB_0011e759:
        luaT_tryconcatTM(L);
LAB_0011e761:
        iVar12 = 1;
      }
      total = total - iVar12;
      (L->top).p = (L->top).p + -(long)iVar12;
    } while (1 < total);
  }
  return;
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  if (total == 1)
    return;  /* "all" values already concatenated */
  do {
    StkId top = L->top.p;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(s2v(top - 2)) || cvt2str(s2v(top - 2))) ||
        !tostring(L, s2v(top - 1)))
      luaT_tryconcatTM(L);  /* may invalidate 'top' */
    else if (isemptystr(s2v(top - 1)))  /* second operand is empty? */
      cast_void(tostring(L, s2v(top - 2)));  /* result is first operand */
    else if (isemptystr(s2v(top - 2))) {  /* first operand is empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsslen(tsvalue(s2v(top - 1)));
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, s2v(top - n - 1)); n++) {
        size_t l = tsslen(tsvalue(s2v(top - n - 1)));
        if (l_unlikely(l >= MAX_SIZE - sizeof(TString) - tl)) {
          L->top.p = top - total;  /* pop strings to avoid wasting stack */
          luaG_runerror(L, "string length overflow");
        }
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getlngstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n - 1;  /* got 'n' strings to create one new */
    L->top.p -= n - 1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}